

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CBufferData<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CBufferData<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  pointer puVar1;
  int iVar2;
  uint sizeX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  void *pvVar4;
  uint uVar5;
  uint in_R9D;
  uint valueMax;
  uint valueMax_00;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  uint in_stack_ffffffffffffe268;
  CDataArray dataTest;
  CDataArray dataRef9;
  CDataArray dataRef2;
  CDataArray dataRef1;
  CDataArray dataRef7;
  CDataArray dataRef6;
  CDataArray dataRef5;
  DIResult result;
  DILogger local_1b30;
  DILogger local_19b0;
  DILogger local_1830;
  DILogger local_16b0;
  DILogger local_1530;
  DILogger local_13b0;
  DILogger local_1230;
  DILogger local_10b0;
  DILogger local_f30;
  DILogger local_db0;
  DILogger local_c30;
  DILogger local_ab0;
  DILogger local_930;
  DILogger local_7b0;
  DILogger local_630;
  DILogger local_4b0;
  DILogger local_330;
  DILogger local_1b0;
  
  result.logger_.null_log_ = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result.logger_.str_);
  result.status_ = 0;
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar5 = 0x4000;
  if ((int)*(uint *)CONCAT44(extraout_var,iVar2) < 0x4000) {
    uVar5 = *(uint *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar7 = *(uint *)(CONCAT44(extraout_var_00,iVar2) + 4);
  uVar8 = (ulong)uVar7;
  if ((int)(0x10000 / (long)(int)uVar5) < (int)uVar7) {
    uVar8 = 0x10000 / (long)(int)uVar5 & 0xffffffff;
  }
  sizeX = (uint)uVar8;
  dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dataTest,(long)(int)(sizeX * uVar5),(value_type_conflict4 *)&dataRef1,
             (allocator_type *)&dataRef2);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,10,this->_buffers);
  dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef1,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0x32,in_R9D
            );
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[1]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[1]);
  DIResult::sub_result(&local_1b0,&result,lVar3);
  DILogger::~DILogger(&local_1b0);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  uVar7 = sizeX;
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef1,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_330,&result,lVar3);
  DILogger::~DILogger(&local_330);
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef2,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,10,0x46,uVar7
            );
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[2]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e0);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[2]);
  DIResult::sub_result(&local_4b0,&result,lVar3);
  DILogger::~DILogger(&local_4b0);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  uVar7 = sizeX;
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_630,&result,lVar3);
  DILogger::~DILogger(&local_630);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[3]);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,300,(void *)0x0,0x88e4);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[3]);
  DIResult::sub_result(&local_7b0,&result,lVar3);
  DILogger::~DILogger(&local_7b0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[4]);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,400,(void *)0x0,0x88e9);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[4]);
  DIResult::sub_result(&local_930,&result,lVar3);
  DILogger::~DILogger(&local_930);
  dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef5,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0x32,uVar7)
  ;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[5]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e1);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[5]);
  DIResult::sub_result(&local_ab0,&result,lVar3);
  DILogger::~DILogger(&local_ab0);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  uVar7 = sizeX;
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef5,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_c30,&result,lVar3);
  DILogger::~DILogger(&local_c30);
  dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef6,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,10,0x28,uVar7
            );
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[6]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e5);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[6]);
  DIResult::sub_result(&local_db0,&result,lVar3);
  DILogger::~DILogger(&local_db0);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  uVar7 = sizeX;
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef6,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_f30,&result,lVar3);
  DILogger::~DILogger(&local_f30);
  dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef7,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,4,0x46,uVar7)
  ;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[7]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88ea);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[7]);
  DIResult::sub_result(&local_10b0,&result,lVar3);
  DILogger::~DILogger(&local_10b0);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  uVar7 = sizeX;
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef7,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_1230,&result,lVar3);
  DILogger::~DILogger(&local_1230);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[8]);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,800,(void *)0x0,0x88e2);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[8]);
  DIResult::sub_result(&local_13b0,&result,lVar3);
  DILogger::~DILogger(&local_13b0);
  dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef9,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0x12,0x23,
             uVar7);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[9]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e6);
  lVar3 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                    (&this->super_DrawIndirectBase,this->_buffers[9]);
  DIResult::sub_result(&local_1530,&result,lVar3);
  DILogger::~DILogger(&local_1530);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef9,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_16b0,&result,lVar3);
  DILogger::~DILogger(&local_16b0);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e6);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  valueMax = sizeX;
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef9,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,sizeX,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_1830,&result,lVar3);
  DILogger::~DILogger(&local_1830);
  uVar7 = uVar5 * 2;
  valueMax_00 = sizeX * 2;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef9,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar7,valueMax_00,0x12,
             0x23,valueMax);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&dataTest,
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e6);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef9,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar7,valueMax_00
                     ,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar7,valueMax_00
                     ,0,0,in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_19b0,&result,lVar3);
  DILogger::~DILogger(&local_19b0);
  uVar5 = (int)uVar5 / 2;
  uVar7 = (int)((int)(uVar8 >> 0x1f) + sizeX) >> 1;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef9,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,uVar7,0x12,0x23,
             valueMax_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&dataTest,
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e6);
  puVar1 = dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,sVar6,1);
  memcpy(puVar1,pvVar4,sVar6);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
  lVar3 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef9,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,uVar7,
                     (uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar5,uVar7,0,0,
                     in_stack_ffffffffffffe268);
  DIResult::sub_result(&local_1b30,&result,lVar3);
  DILogger::~DILogger(&local_1b30);
  lVar3 = result.status_;
  if (dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef9.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef7.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef6.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataRef1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DILogger::~DILogger(&result.logger_);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		int dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);

		CDataArray dataTest(dataWidth * dataHeight, 0);

		glGenBuffers(sizeof(_buffers) / sizeof(_buffers[0]), _buffers);
		CDataArray dataRef1;
		DataGen<unsigned int>(dataRef1, dataWidth, dataHeight, 0, 50);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[1]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef1.size() * sizeof(unsigned int)), &dataRef1[0],
					 GL_DYNAMIC_DRAW);
		result.sub_result(BindingPointCheck<api>(_buffers[1]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef1, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataRef2;
		DataGen<unsigned int>(dataRef2, dataWidth, dataHeight, 10, 70);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[2]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef2.size() * sizeof(unsigned int)), &dataRef2[0],
					 GL_STREAM_DRAW);
		result.sub_result(BindingPointCheck<api>(_buffers[2]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef2, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[3]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 300, NULL, GL_STATIC_DRAW);
		result.sub_result(BindingPointCheck<api>(_buffers[3]));

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[4]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 400, NULL, GL_DYNAMIC_READ);
		result.sub_result(BindingPointCheck<api>(_buffers[4]));

		CDataArray dataRef5;
		DataGen<unsigned int>(dataRef5, dataWidth, dataHeight, 0, 50);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[5]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef5.size() * sizeof(unsigned int)), &dataRef5[0],
					 GL_STREAM_READ);
		result.sub_result(BindingPointCheck<api>(_buffers[5]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef5, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataRef6;
		DataGen<unsigned int>(dataRef6, dataWidth, dataHeight, 10, 40);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[6]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef6.size() * sizeof(unsigned int)), &dataRef6[0],
					 GL_STATIC_READ);
		result.sub_result(BindingPointCheck<api>(_buffers[6]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef6, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		CDataArray dataRef7;
		DataGen<unsigned int>(dataRef7, dataWidth, dataHeight, 4, 70);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[7]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef7.size() * sizeof(unsigned int)), &dataRef7[0],
					 GL_DYNAMIC_COPY);
		result.sub_result(BindingPointCheck<api>(_buffers[7]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef7, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[8]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 800, NULL, GL_STREAM_COPY);
		result.sub_result(BindingPointCheck<api>(_buffers[8]));

		CDataArray dataRef9;
		DataGen<unsigned int>(dataRef9, dataWidth, dataHeight, 18, 35);

		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[9]);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		result.sub_result(BindingPointCheck<api>(_buffers[9]));

		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef9, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		//reallocation: same size
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(DataCompare(dataRef9, dataWidth, dataHeight, dataTest, dataWidth, dataHeight));

		//reallocation: larger size
		DataGen<unsigned int>(dataRef9, dataWidth * 2, dataHeight * 2, 18, 35);
		dataTest.resize(dataRef9.size());
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(
			DataCompare(dataRef9, dataWidth * 2, dataHeight * 2, dataTest, dataWidth * 2, dataHeight * 2));

		//reallocation: smaller size
		DataGen<unsigned int>(dataRef9, dataWidth / 2, dataHeight / 2, 18, 35);
		dataTest.resize(dataRef9.size());
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef9.size() * sizeof(unsigned int)), &dataRef9[0],
					 GL_STATIC_COPY);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);
		result.sub_result(
			DataCompare(dataRef9, dataWidth / 2, dataHeight / 2, dataTest, dataWidth / 2, dataHeight / 2));

		return result.code();
	}